

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

bool icu_63::number::impl::GeneratorHelpers::precision
               (MacroProps *macros,UnicodeString *sb,UErrorCode *status)

{
  uint *puVar1;
  UErrorCode *extraout_RDX;
  int32_t maxSig;
  int32_t minSig;
  ConstChar16Ptr local_70;
  ConstChar16Ptr local_68;
  ConstChar16Ptr local_60;
  ConstChar16Ptr local_58 [3];
  char16_t *local_40;
  
  puVar1 = &switchD_0025ba51::switchdataD_002e04c8;
  switch((macros->precision).fType) {
  case RND_NONE:
    local_58[0].p_ = L"precision-unlimited";
    UnicodeString::append(sb,local_58,-1);
    break;
  case RND_FRACTION:
    blueprint_helpers::generateFractionStem
              ((int)(macros->precision).fUnion.fracSig.fMinFrac,
               (int)(macros->precision).fUnion.fracSig.fMaxFrac,sb,
               (UErrorCode *)&switchD_0025ba51::switchdataD_002e04c8);
    break;
  case RND_SIGNIFICANT:
    minSig = (int32_t)(macros->precision).fUnion.fracSig.fMinSig;
    maxSig = (int32_t)(macros->precision).fUnion.fracSig.fMaxSig;
    goto LAB_0025bb44;
  case RND_FRACTION_SIGNIFICANT:
    blueprint_helpers::generateFractionStem
              ((int)(macros->precision).fUnion.fracSig.fMinFrac,
               (int)(macros->precision).fUnion.fracSig.fMaxFrac,sb,
               (UErrorCode *)&switchD_0025ba51::switchdataD_002e04c8);
    UnicodeString::append(sb,L'/');
    minSig = (int32_t)(macros->precision).fUnion.fracSig.fMinSig;
    if (minSig == -1) {
      maxSig = (int32_t)(macros->precision).fUnion.fracSig.fMaxSig;
      minSig = 1;
    }
    else {
      maxSig = -1;
    }
LAB_0025bb44:
    blueprint_helpers::generateDigitsStem(minSig,maxSig,sb,(UErrorCode *)puVar1);
    break;
  case RND_INCREMENT:
    local_60.p_ = L"precision-increment/";
    UnicodeString::append(sb,&local_60,-1);
    local_40 = local_60.p_;
    blueprint_helpers::generateIncrementOption
              ((macros->precision).fUnion.increment.fIncrement,
               (int)(macros->precision).fUnion.increment.fMinFrac -
               (int)(macros->precision).fUnion.increment.fMaxFrac,sb,extraout_RDX);
    break;
  case RND_CURRENCY:
    if ((macros->precision).fUnion.currencyUsage == UCURR_USAGE_STANDARD) {
      local_68.p_ = L"precision-currency-standard";
      UnicodeString::append(sb,&local_68,-1);
    }
    else {
      local_70.p_ = L"precision-currency-cash";
      UnicodeString::append(sb,&local_70,-1);
    }
    break;
  default:
    return false;
  }
  return true;
}

Assistant:

bool GeneratorHelpers::precision(const MacroProps& macros, UnicodeString& sb, UErrorCode& status) {
    if (macros.precision.fType == Precision::RND_NONE) {
        sb.append(u"precision-unlimited", -1);
    } else if (macros.precision.fType == Precision::RND_FRACTION) {
        const Precision::FractionSignificantSettings& impl = macros.precision.fUnion.fracSig;
        blueprint_helpers::generateFractionStem(impl.fMinFrac, impl.fMaxFrac, sb, status);
    } else if (macros.precision.fType == Precision::RND_SIGNIFICANT) {
        const Precision::FractionSignificantSettings& impl = macros.precision.fUnion.fracSig;
        blueprint_helpers::generateDigitsStem(impl.fMinSig, impl.fMaxSig, sb, status);
    } else if (macros.precision.fType == Precision::RND_FRACTION_SIGNIFICANT) {
        const Precision::FractionSignificantSettings& impl = macros.precision.fUnion.fracSig;
        blueprint_helpers::generateFractionStem(impl.fMinFrac, impl.fMaxFrac, sb, status);
        sb.append(u'/');
        if (impl.fMinSig == -1) {
            blueprint_helpers::generateDigitsStem(1, impl.fMaxSig, sb, status);
        } else {
            blueprint_helpers::generateDigitsStem(impl.fMinSig, -1, sb, status);
        }
    } else if (macros.precision.fType == Precision::RND_INCREMENT) {
        const Precision::IncrementSettings& impl = macros.precision.fUnion.increment;
        sb.append(u"precision-increment/", -1);
        blueprint_helpers::generateIncrementOption(
                impl.fIncrement,
                impl.fMinFrac - impl.fMaxFrac,
                sb,
                status);
    } else if (macros.precision.fType == Precision::RND_CURRENCY) {
        UCurrencyUsage usage = macros.precision.fUnion.currencyUsage;
        if (usage == UCURR_USAGE_STANDARD) {
            sb.append(u"precision-currency-standard", -1);
        } else {
            sb.append(u"precision-currency-cash", -1);
        }
    } else {
        // Bogus or Error
        return false;
    }

    // NOTE: Always return true for rounding because the default value depends on other options.
    return true;
}